

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O0

bool __thiscall
cmExportCommand::HandlePackage
          (cmExportCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  undefined8 content;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  ulong uVar5;
  char *pcVar6;
  allocator local_509;
  string local_508;
  undefined1 local_4e8 [8];
  string hash;
  char *outDir;
  string local_4b8;
  string local_498;
  undefined1 local_478 [8];
  ostringstream e_1;
  undefined1 local_300 [8];
  RegularExpression packageRegex;
  char *packageExpr;
  string local_220;
  undefined4 local_1fc;
  string local_1f8;
  undefined1 local_1d8 [8];
  ostringstream e;
  uint local_4c;
  undefined1 local_48 [4];
  uint i;
  string package;
  Doing doing;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmExportCommand *this_local;
  
  package.field_2._12_4_ = 1;
  std::__cxx11::string::string((string *)local_48);
  local_4c = 1;
  do {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar2 <= local_4c) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        packageRegex.searchstring = "^[A-Za-z0-9_.-]+$";
        cmsys::RegularExpression::RegularExpression
                  ((RegularExpression *)local_300,"^[A-Za-z0-9_.-]+$");
        pcVar6 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_300,pcVar6);
        if (bVar1) {
          this_00 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_4b8,"CMAKE_EXPORT_NO_PACKAGE_REGISTRY",
                     (allocator *)((long)&outDir + 7));
          bVar1 = cmMakefile::IsOn(this_00,&local_4b8);
          std::__cxx11::string::~string((string *)&local_4b8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&outDir + 7));
          if (bVar1) {
            this_local._7_1_ = true;
            local_1fc = 1;
          }
          else {
            pcVar6 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
            hash.field_2._8_8_ = pcVar6;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_508,pcVar6,&local_509);
            cmSystemTools::ComputeStringMD5((string *)local_4e8,&local_508);
            std::__cxx11::string::~string((string *)&local_508);
            std::allocator<char>::~allocator((allocator<char> *)&local_509);
            content = hash.field_2._8_8_;
            pcVar6 = (char *)std::__cxx11::string::c_str();
            StorePackageRegistryDir(this,(string *)local_48,(char *)content,pcVar6);
            this_local._7_1_ = true;
            local_1fc = 1;
            std::__cxx11::string::~string((string *)local_4e8);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_478);
          poVar4 = std::operator<<((ostream *)local_478,"PACKAGE given invalid package name \"");
          poVar4 = std::operator<<(poVar4,(string *)local_48);
          poVar4 = std::operator<<(poVar4,"\".  ");
          poVar4 = std::operator<<(poVar4,"Package names must match \"");
          poVar4 = std::operator<<(poVar4,packageRegex.searchstring);
          std::operator<<(poVar4,"\".");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,&local_498);
          std::__cxx11::string::~string((string *)&local_498);
          this_local._7_1_ = false;
          local_1fc = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_478);
        }
        cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_300);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_220,"PACKAGE must be given a package name.",
                   (allocator *)((long)&packageExpr + 7));
        cmCommand::SetError(&this->super_cmCommand,&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator((allocator<char> *)((long)&packageExpr + 7));
        this_local._7_1_ = false;
        local_1fc = 1;
      }
LAB_006e213a:
      std::__cxx11::string::~string((string *)local_48);
      return this_local._7_1_;
    }
    if (package.field_2._12_4_ != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
      poVar4 = std::operator<<((ostream *)local_1d8,"PACKAGE given unknown argument: ");
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)local_4c);
      std::operator<<(poVar4,(string *)pvVar3);
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      this_local._7_1_ = false;
      local_1fc = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
      goto LAB_006e213a;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)local_4c);
    std::__cxx11::string::operator=((string *)local_48,(string *)pvVar3);
    package.field_2._12_4_ = 0;
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

bool cmExportCommand::HandlePackage(std::vector<std::string> const& args)
{
  // Parse PACKAGE mode arguments.
  enum Doing { DoingNone, DoingPackage };
  Doing doing = DoingPackage;
  std::string package;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    if(doing == DoingPackage)
      {
      package = args[i];
      doing = DoingNone;
      }
    else
      {
      std::ostringstream e;
      e << "PACKAGE given unknown argument: " << args[i];
      this->SetError(e.str());
      return false;
      }
    }

  // Verify the package name.
  if(package.empty())
    {
    this->SetError("PACKAGE must be given a package name.");
    return false;
    }
  const char* packageExpr = "^[A-Za-z0-9_.-]+$";
  cmsys::RegularExpression packageRegex(packageExpr);
  if(!packageRegex.find(package.c_str()))
    {
    std::ostringstream e;
    e << "PACKAGE given invalid package name \"" << package << "\".  "
      << "Package names must match \"" << packageExpr << "\".";
    this->SetError(e.str());
    return false;
    }

  // If the CMAKE_EXPORT_NO_PACKAGE_REGISTRY variable is set the command
  // export(PACKAGE) does nothing.
  if(this->Makefile->IsOn("CMAKE_EXPORT_NO_PACKAGE_REGISTRY"))
    {
    return true;
    }

  // We store the current build directory in the registry as a value
  // named by a hash of its own content.  This is deterministic and is
  // unique with high probability.
  const char* outDir = this->Makefile->GetCurrentBinaryDirectory();
  std::string hash = cmSystemTools::ComputeStringMD5(outDir);
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->StorePackageRegistryWin(package, outDir, hash.c_str());
#else
  this->StorePackageRegistryDir(package, outDir, hash.c_str());
#endif

  return true;
}